

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc-attack-detector.c
# Opt level: O1

_Bool check_crc(uint8_t *S,uint8_t *buf,uint32_t len,uint8_t *IV)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  long *plVar3;
  ptrlen data;
  ptrlen data_00;
  ptrlen data_01;
  ptrlen data_02;
  
  uVar1 = 0;
  if ((IV != (uint8_t *)0x0) && (uVar1 = 0, *(long *)S == *(long *)IV)) {
    data.len = 4;
    data.ptr = "\x01";
    uVar1 = crc32_update(0,data);
    data_00.len = 4;
    data_00.ptr = "";
    uVar1 = crc32_update(uVar1,data_00);
  }
  if (len != 0) {
    plVar3 = (long *)(buf + len);
    do {
      puVar2 = "\x01";
      if (*(long *)S != *(long *)buf) {
        puVar2 = "";
      }
      data_01.len = 4;
      data_01.ptr = puVar2;
      uVar1 = crc32_update(uVar1,data_01);
      data_02.len = 4;
      data_02.ptr = "";
      uVar1 = crc32_update(uVar1,data_02);
      buf = (uint8_t *)((long)buf + 8);
    } while (buf < plVar3);
  }
  return uVar1 == 0;
}

Assistant:

static bool check_crc(const uint8_t *S, const uint8_t *buf,
                      uint32_t len, const uint8_t *IV)
{
    uint32_t crc;
    const uint8_t *c;

    crc = 0;
    if (IV && !CMP(S, IV)) {
        crc_update(&crc, ONE);
        crc_update(&crc, ZERO);
    }
    for (c = buf; c < buf + len; c += SSH_BLOCKSIZE) {
        if (!CMP(S, c)) {
            crc_update(&crc, ONE);
            crc_update(&crc, ZERO);
        } else {
            crc_update(&crc, ZERO);
            crc_update(&crc, ZERO);
        }
    }
    return (crc == 0);
}